

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bet.cpp
# Opt level: O0

uint __thiscall Bet::selectBetSuperFire10(Bet *this,uint *bet,double *credit)

{
  uint uVar1;
  bool bVar2;
  ostream *poVar3;
  reference pvVar4;
  size_type sVar5;
  char *pcVar6;
  long lVar7;
  undefined1 local_148 [8];
  Start startgame;
  SelectGame selectgame_1;
  SelectGame selectgame;
  int i;
  CreditField repeatInput;
  int countBelow;
  int countAbove;
  string y;
  string confirm;
  undefined1 local_80 [8];
  string okay;
  value_type_conflict local_58;
  uint tenEuro;
  uint eightEuro;
  uint sixEuro;
  uint FourEuro;
  value_type_conflict local_3c;
  undefined1 local_38 [4];
  uint twoEuro;
  vector<unsigned_int,_std::allocator<unsigned_int>_> betVector;
  double *credit_local;
  uint *bet_local;
  Bet *this_local;
  
  betVector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)credit;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38);
  local_3c = 2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,&local_3c);
  eightEuro = 4;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,&eightEuro);
  tenEuro = 6;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,&tenEuro);
  local_58 = 8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,
             &stack0xffffffffffffffa8);
  okay.field_2._12_4_ = 10;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,
             (value_type_conflict *)(okay.field_2._M_local_buf + 0xc));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_80,"ok",(allocator<char> *)(confirm.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(confirm.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string((string *)(y.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&countBelow);
  repeatInput._credit._4_4_ = 0;
  repeatInput._credit._0_4_ = 0;
  CreditField::CreditField((CreditField *)&stack0xffffffffffffff28);
  while (this->_credit_bet <= 2.0 && this->_credit_bet != 2.0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Please insert Credit! The minimum is 2 Euro! ");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    CreditField::AddCredit((CreditField *)&stack0xffffffffffffff28,&this->_credit_bet);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,">>>The minimum bet is: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,2);
  poVar3 = std::operator<<(poVar3," Euro and the max bet is: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,10);
  poVar3 = std::operator<<(poVar3," Euro! ");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,">>>Current Bet: ");
  pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,0);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar4);
  poVar3 = std::operator<<(poVar3," Euro");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  if (2.0 <= this->_credit_bet) {
    poVar3 = std::operator<<((ostream *)&std::cout,">>>Please, Select Bet! ");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    if (10.0 <= this->_credit_bet) {
      poVar3 = std::operator<<((ostream *)&std::cout,">>>Play On Max Bet!");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    if (this->_credit_bet <= 10.0 && this->_credit_bet != 10.0) {
      poVar3 = std::operator<<((ostream *)&std::cout,">>>Insert credit to play on max bet! ");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "********************************************************************************************************************"
                            );
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
LAB_001066ca:
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&y.field_2 + 8),
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_80);
    if (bVar2) {
      poVar3 = std::operator<<((ostream *)&std::cout,"---Press y to increase the bet! ");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&std::cout,"---Press n to decrease the bet!");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&std::cout,"---Press q to quit!");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&std::cout,"---Press o to play with current bet!");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&std::cout,"---Press m for more games!");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "********************************************************************************************************************"
                              );
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::operator>>((istream *)&std::cin,(string *)&countBelow);
      for (selectgame._credits._4_4_ = 0;
          sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38),
          (ulong)(long)selectgame._credits._4_4_ < sVar5;
          selectgame._credits._4_4_ = selectgame._credits._4_4_ + 2) {
        pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&countBelow);
        if ((*pcVar6 == 'y') && (lVar7 = std::__cxx11::string::size(), lVar7 == 1)) {
          if ((double)*bet < this->_credit_bet) {
            pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,
                                (long)selectgame._credits._4_4_);
            if (*pvVar4 < 10) {
              if ((*(double *)
                    betVector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage == 2.0) &&
                 (!NAN(*(double *)
                        betVector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage))) {
                *bet = 2;
              }
              if ((this->_credit_bet != 2.0) || (NAN(this->_credit_bet))) {
                pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,
                                    (long)selectgame._credits._4_4_);
                *pvVar4 = *pvVar4 + 2;
                pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,
                                    (long)selectgame._credits._4_4_);
                *bet = *pvVar4;
              }
              else {
                *bet = 2;
              }
              repeatInput._credit._0_4_ = 0;
            }
            else {
              pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,
                                  (long)selectgame._credits._4_4_);
              *pvVar4 = 10;
              pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,
                                  (long)selectgame._credits._4_4_);
              *bet = *pvVar4;
              repeatInput._credit._4_4_ = repeatInput._credit._4_4_ + 1;
            }
            if (0 < repeatInput._credit._4_4_) {
              poVar3 = std::operator<<((ostream *)&std::cout,"You are already playing on max bet!");
              std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            }
            poVar3 = std::operator<<((ostream *)&std::cout,"Your Current bet is: ");
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,*bet);
            poVar3 = std::operator<<(poVar3," Euro");
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          }
          else if (((*(double *)
                      betVector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage != 10.0) ||
                   (NAN(*(double *)
                         betVector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage))) || (*bet != 10)) {
            poVar3 = std::operator<<((ostream *)&std::cout,"Not enough credits to increase the bet!"
                                    );
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            poVar3 = std::operator<<((ostream *)&std::cout,"Credits: ");
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->_credit_bet);
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            poVar3 = std::operator<<((ostream *)&std::cout,"Bet: ");
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,*bet);
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          }
          else {
            poVar3 = std::operator<<((ostream *)&std::cout,"You are already playing on max bet!");
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            poVar3 = std::operator<<((ostream *)&std::cout,"Your Current bet is: ");
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,*bet);
            poVar3 = std::operator<<(poVar3," Euro");
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          }
          break;
        }
        pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&countBelow);
        if ((*pcVar6 == 'n') && (lVar7 = std::__cxx11::string::size(), lVar7 == 1)) {
          pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,
                              (long)selectgame._credits._4_4_);
          if (*pvVar4 < 3) {
            pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,
                                (long)selectgame._credits._4_4_);
            *pvVar4 = 2;
            pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,
                                (long)selectgame._credits._4_4_);
            *bet = *pvVar4;
            repeatInput._credit._0_4_ = repeatInput._credit._0_4_ + 1;
          }
          else {
            pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,
                                (long)selectgame._credits._4_4_);
            *pvVar4 = *pvVar4 - 2;
            pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,
                                (long)selectgame._credits._4_4_);
            *bet = *pvVar4;
            repeatInput._credit._0_4_ = 0;
          }
          if (0 < repeatInput._credit._0_4_) {
            poVar3 = std::operator<<((ostream *)&std::cout,"You are already playing on minimum bet!"
                                    );
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          }
          poVar3 = std::operator<<((ostream *)&std::cout,"Your Current bet is: ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,*bet);
          poVar3 = std::operator<<(poVar3," Euro");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          break;
        }
        pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&countBelow);
        if ((*pcVar6 == 'q') && (lVar7 = std::__cxx11::string::size(), lVar7 == 1)) {
          poVar3 = std::operator<<((ostream *)&std::cout,"Cashout...");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          poVar3 = std::operator<<((ostream *)&std::cout,"Handpay! Call Attendant! ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->_credit_bet);
          poVar3 = std::operator<<(poVar3," Euro!");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          SelectGame::SelectGame((SelectGame *)&selectgame_1._credits);
          SelectGame::selectGame_Welcome((SelectGame *)&selectgame_1._credits);
          SelectGame::selectGame_Games((SelectGame *)&selectgame_1._credits);
          betVector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage[0] = 0;
          betVector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage[1] = 0;
          SelectGame::selectGame_Option
                    ((SelectGame *)&selectgame_1._credits,
                     (double *)
                     betVector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
          SelectGame::~SelectGame((SelectGame *)&selectgame_1._credits);
          break;
        }
        pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&countBelow);
        if ((*pcVar6 == 'm') && (lVar7 = std::__cxx11::string::size(), lVar7 == 1)) {
          SelectGame::SelectGame((SelectGame *)&startgame._bet);
          SelectGame::selectGame_Welcome((SelectGame *)&startgame._bet);
          SelectGame::selectGame_Games((SelectGame *)&startgame._bet);
          SelectGame::selectGame_Option
                    ((SelectGame *)&startgame._bet,
                     (double *)
                     betVector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
          SelectGame::~SelectGame((SelectGame *)&startgame._bet);
        }
        pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&countBelow);
        if ((*pcVar6 == 'o') && (lVar7 = std::__cxx11::string::size(), lVar7 == 1)) {
          pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,
                              (long)selectgame._credits._4_4_);
          *bet = *pvVar4;
          std::__cxx11::string::operator=((string *)(y.field_2._M_local_buf + 8),"ok");
          Start::Start((Start *)local_148);
          Start::StartGameNowSuperFire10((Start *)local_148,&this->_credit_bet,bet);
          Start::~Start((Start *)local_148);
          break;
        }
        poVar3 = std::operator<<((ostream *)&std::cout,"Invalid Input");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        *bet = 2;
        std::operator>>((istream *)&std::cin,(string *)&countBelow);
      }
      goto LAB_001066ca;
    }
  }
  uVar1 = *bet;
  CreditField::~CreditField((CreditField *)&stack0xffffffffffffff28);
  std::__cxx11::string::~string((string *)&countBelow);
  std::__cxx11::string::~string((string *)(y.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_80);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38);
  return uVar1;
}

Assistant:

unsigned int Bet::selectBetSuperFire10(unsigned int& bet, double& credit) {

	std::vector<unsigned int> betVector;
	
	unsigned const int twoEuro = 2;
	betVector.push_back(twoEuro);
	
	unsigned const int FourEuro = 4;
	betVector.push_back(FourEuro);

	unsigned const int sixEuro = 6;
	betVector.push_back(sixEuro);

	unsigned const int eightEuro = 8;
	betVector.push_back(eightEuro);

	unsigned const int tenEuro = 10;
	betVector.push_back(tenEuro);

	

	std::string okay = "ok";
	std::string confirm;
	std::string y;
	int countAbove = 0;
	int countBelow = 0;

	//if credit < 1
	//if credit < 5
	//if credit< cannot increase!
	CreditField repeatInput;

	while (_credit_bet < twoEuro) {

		std::cout << "Please insert Credit! The minimum is 2 Euro! " << std::endl;
		repeatInput.AddCredit(_credit_bet);

	}
	std::cout << ">>>The minimum bet is: " << twoEuro << " Euro and the max bet is: " << tenEuro << " Euro! " << std::endl;
	std::cout << ">>>Current Bet: " << betVector[0] << " Euro" << std::endl;
	if (_credit_bet >= twoEuro) {
		std::cout << ">>>Please, Select Bet! " << std::endl;
		if (_credit_bet >= tenEuro) {
			std::cout << ">>>Play On Max Bet!" << std::endl;
		}
		if (_credit_bet < tenEuro) {
			std::cout << ">>>Insert credit to play on max bet! " << std::endl;
		}
		std::cout << "********************************************************************************************************************" << std::endl;
		while (confirm != okay) {
			std::cout << "---Press y to increase the bet! " << std::endl;
			std::cout << "---Press n to decrease the bet!" << std::endl;
			std::cout << "---Press q to quit!" << std::endl;
			std::cout << "---Press o to play with current bet!" << std::endl;
			std::cout << "---Press m for more games!" << std::endl;
			std::cout << "********************************************************************************************************************" << std::endl;
			std::cin >> y;
			//new code here for safety
			/*while (y.size() > 1) {

				std::cin >> y;
			}*/
			for (int i = 0; i < betVector.size(); i+=2) {
				if (y[0] == 'y' && y.size() == 1) {
					if (_credit_bet <= bet) {
						if (credit == tenEuro && bet == tenEuro) {
							std::cout << "You are already playing on max bet!" << std::endl;
							std::cout << "Your Current bet is: " << bet << " Euro" << std::endl;
							break;
						}
						else {
							std::cout << "Not enough credits to increase the bet!" << std::endl;
							std::cout << "Credits: " << _credit_bet << std::endl;
							std::cout << "Bet: " << bet << std::endl;

							break;
						}

					}
					else {

						if (betVector[i] >= tenEuro) {
							betVector[i] = tenEuro;
							bet = betVector[i];
							countAbove++;
						}
						else {
							if (credit == twoEuro) {
								bet = twoEuro;
							}
							if (_credit_bet == twoEuro) {
								bet = twoEuro;
							}
							else {

								betVector[i] += twoEuro;
								bet = betVector[i];
							}

							countBelow = 0;
						}
						if (countAbove > 0) {
							std::cout << "You are already playing on max bet!" << std::endl;
						}
						std::cout << "Your Current bet is: " << bet << " Euro" << std::endl;
						break;
					}

				}
				if (y[0] == 'n' && y.size() == 1) {

					if (betVector[i] <= twoEuro) {
						betVector[i] = twoEuro;
						bet = betVector[i];
						countBelow++;
					}
					else {
						betVector[i] -= 2;
						bet = betVector[i];
						countBelow = 0;
					}
					if (countBelow > 0) {
						std::cout << "You are already playing on minimum bet!" << std::endl;
					}
					std::cout << "Your Current bet is: " << bet << " Euro" << std::endl;
					break;
				}
				if (y[0] == 'q' && y.size() == 1) {
					std::cout << "Cashout..." << std::endl;
					std::cout << "Handpay! Call Attendant! " << _credit_bet << " Euro!" << std::endl;
					//std::chrono::seconds duration(3);
					//std::this_thread::sleep_for(duration);
					SelectGame selectgame;
					selectgame.selectGame_Welcome();
					selectgame.selectGame_Games();
					credit = 0;
					//choosing a game
					selectgame.selectGame_Option(credit);
					
					//exit(0);
					break;
				}
				if (y[0] == 'm' && y.size() == 1) {
					SelectGame selectgame;
					selectgame.selectGame_Welcome();
					selectgame.selectGame_Games();

					//choosing a game
					selectgame.selectGame_Option(credit);
				}

				if (y[0] == 'o' && y.size() == 1) {
					bet = betVector[i];
					confirm = "ok";
					Start startgame;
					startgame.StartGameNowSuperFire10(_credit_bet,bet);
					break;
				}
				else {
					std::cout << "Invalid Input" << std::endl;
					bet = twoEuro;
					std::cin >> y;
				}
			}
		}
	}
	return bet;
}